

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_progress_bar_display.cpp
# Opt level: O3

void __thiscall duckdb::TerminalProgressBarDisplay::Finish(TerminalProgressBarDisplay *this)

{
  string local_30;
  
  PrintProgressInternal(this,100);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,anon_var_dwarf_63b9037 + 8,anon_var_dwarf_63b9037 + 9);
  Printer::RawPrint(STREAM_STDOUT,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  Printer::Flush(STREAM_STDOUT);
  return;
}

Assistant:

void TerminalProgressBarDisplay::Finish() {
	PrintProgressInternal(100);
	Printer::RawPrint(OutputStream::STREAM_STDOUT, "\n");
	Printer::Flush(OutputStream::STREAM_STDOUT);
}